

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O0

Error asmjit::v1_14::a64::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  bool bVar1;
  uchar *puVar2;
  undefined1 *in_RDX;
  CallConvId in_SIL;
  undefined1 *in_RDI;
  undefined4 in_stack_ffffffffffffe278;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffe27c;
  undefined4 in_stack_ffffffffffffe280;
  RegMask regs;
  undefined4 in_stack_ffffffffffffe284;
  RegGroup RVar4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe28c;
  uint32_t in_stack_ffffffffffffe2c4;
  uint32_t in_stack_ffffffffffffe2c8;
  uint32_t in_stack_ffffffffffffe2cc;
  uint32_t in_stack_ffffffffffffe2d0;
  undefined4 in_stack_ffffffffffffe2d4;
  undefined4 in_stack_ffffffffffffe2d8;
  undefined4 in_stack_ffffffffffffe2dc;
  uint32_t in_stack_ffffffffffffe310;
  uint32_t in_stack_ffffffffffffe318;
  uint32_t in_stack_ffffffffffffe320;
  uint32_t in_stack_ffffffffffffe328;
  undefined1 local_15c9;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined4 local_15c0;
  undefined4 local_15bc [4];
  CallConvId local_15a9;
  undefined1 *local_15a8;
  undefined1 local_1599;
  undefined1 local_1581;
  undefined4 local_1570;
  undefined1 local_1569;
  undefined1 *local_1568;
  undefined4 local_1560;
  undefined1 local_1559;
  undefined1 *local_1558;
  undefined4 local_1550;
  undefined1 local_1549;
  undefined4 local_1540;
  undefined1 local_1539;
  undefined1 *local_1538;
  undefined4 local_1530;
  undefined1 local_1529;
  undefined1 *local_1528;
  undefined4 local_1520;
  undefined1 local_1519;
  undefined1 *local_1518;
  undefined4 local_1510;
  undefined1 local_1509;
  undefined1 *local_1508;
  undefined4 local_14fc;
  undefined1 *local_14f8;
  CallConvId local_14e9;
  undefined1 *local_14e8;
  undefined1 local_14d9;
  undefined1 *local_14d8;
  undefined4 local_14d0;
  undefined4 local_14cc;
  undefined4 local_14c8;
  undefined4 local_14c4;
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined4 *local_14a0;
  undefined4 local_1494;
  undefined4 local_1490;
  undefined4 local_148c;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 *local_1478;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined4 local_145c;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  undefined4 local_1448;
  undefined4 local_1444;
  undefined4 local_1440;
  undefined4 local_143c;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 local_1424;
  undefined4 local_1420;
  undefined4 local_141c;
  undefined4 local_1418;
  undefined4 local_1414;
  undefined4 local_1410;
  undefined4 local_140c;
  undefined4 *local_1408;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  undefined4 local_13f0;
  undefined4 local_13ec;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13d8;
  undefined4 local_13d4;
  undefined4 local_13d0;
  undefined4 local_13cc;
  undefined4 local_13c8;
  undefined4 local_13c4;
  undefined4 local_13c0;
  undefined4 local_13bc;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined4 local_13a8;
  undefined4 local_13a4;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 *local_1390;
  undefined4 local_1388;
  undefined4 local_1384;
  undefined4 local_1380;
  undefined4 local_137c;
  undefined4 local_1378;
  undefined4 local_1374;
  undefined4 local_1370;
  undefined4 local_136c;
  undefined4 local_1368;
  undefined4 local_1364;
  undefined4 local_1360;
  undefined4 local_135c;
  undefined4 local_1358;
  undefined4 local_1354;
  undefined4 local_1350;
  undefined4 local_134c;
  undefined4 local_1348;
  undefined4 local_1344;
  undefined4 local_1340;
  undefined4 local_133c;
  undefined4 local_1338;
  undefined4 local_1334;
  undefined4 local_1330;
  undefined4 local_132c;
  undefined4 local_1328;
  undefined4 local_1324;
  undefined4 *local_1320;
  undefined4 *local_1318;
  undefined4 local_130c;
  undefined4 local_1308;
  undefined4 local_1304;
  undefined4 local_1300;
  undefined4 local_12fc;
  undefined4 local_12f8;
  undefined4 local_12f4;
  undefined4 local_12f0;
  undefined4 local_12ec;
  undefined4 local_12e8;
  undefined4 local_12e4;
  undefined4 *local_12e0;
  undefined4 *local_12d8;
  undefined4 *local_12d0;
  undefined4 *local_12c8;
  undefined4 *local_12c0;
  undefined4 *local_12b8;
  undefined4 *local_12b0;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined4 local_12a0;
  undefined4 local_129c;
  undefined4 local_1298;
  undefined4 local_1294;
  undefined4 local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined4 *local_1280;
  undefined4 *local_1278;
  undefined4 *local_1270;
  undefined4 *local_1268;
  undefined4 *local_1260;
  undefined4 *local_1258;
  undefined4 *local_1250;
  undefined4 *local_1248;
  undefined4 local_123c;
  undefined4 local_1238;
  undefined4 local_1234;
  undefined4 local_1230;
  undefined4 local_122c;
  undefined4 local_1228;
  undefined4 local_1224;
  undefined4 local_1220;
  undefined4 local_121c;
  undefined4 *local_1218;
  undefined4 *local_1210;
  undefined4 *local_1208;
  undefined4 local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  undefined4 local_11f0;
  undefined4 local_11ec;
  undefined4 local_11e8;
  undefined4 local_11e4;
  undefined4 *local_11e0;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined4 local_11c4;
  undefined4 local_11c0;
  undefined4 local_11bc;
  undefined4 *local_11b8;
  undefined4 *local_11b0;
  undefined4 *local_11a8;
  undefined4 *local_11a0;
  undefined4 *local_1198;
  undefined4 local_1190;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 local_1184;
  undefined4 local_1180;
  undefined4 local_117c;
  undefined4 *local_1178;
  undefined4 *local_1170;
  undefined4 *local_1168;
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  undefined4 local_1150;
  undefined4 local_114c;
  undefined4 *local_1148;
  undefined4 *local_1140;
  undefined4 *local_1138;
  undefined4 local_112c;
  undefined4 local_1128;
  undefined4 local_1124;
  undefined4 local_1120;
  undefined4 local_111c;
  undefined4 *local_1118;
  undefined4 *local_1110;
  undefined4 *local_1108;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined4 local_10ec;
  undefined4 *local_10e8;
  undefined4 *local_10e0;
  undefined4 *local_10d8;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  undefined4 *local_10c0;
  undefined4 *local_10b8;
  undefined4 *local_10b0;
  undefined4 local_10a8;
  undefined4 local_10a4;
  undefined4 local_10a0;
  undefined4 local_109c;
  undefined4 *local_1098;
  undefined4 *local_1090;
  undefined4 *local_1088;
  undefined4 local_107c;
  undefined4 local_1078;
  undefined4 local_1074;
  undefined4 *local_1070;
  undefined4 *local_1068;
  undefined4 *local_1060;
  undefined4 local_1054;
  undefined4 local_1050;
  undefined4 local_104c;
  undefined4 *local_1048;
  undefined4 *local_1040;
  undefined4 *local_1038;
  undefined4 local_1030;
  undefined4 local_102c;
  undefined4 *local_1028;
  undefined4 *local_1020;
  undefined4 *local_1018;
  undefined4 local_1010;
  undefined4 local_100c;
  undefined4 *local_1008;
  undefined4 *local_1000;
  undefined4 *local_ff8;
  undefined4 local_fec;
  undefined4 *local_fe8;
  undefined4 *local_fe0;
  undefined4 *local_fd8;
  undefined4 *local_fd0;
  undefined4 *local_fc8;
  undefined4 local_fbc;
  undefined4 *local_fb8;
  undefined4 *local_fb0;
  undefined4 *local_fa8;
  undefined4 *local_fa0;
  undefined4 *local_f98;
  undefined4 local_f8c;
  undefined4 local_f88;
  undefined4 local_f84;
  undefined4 local_f80;
  undefined4 local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined4 local_f60;
  undefined4 local_f5c;
  undefined4 local_f58;
  undefined4 local_f54;
  undefined4 local_f50;
  undefined4 local_f4c;
  undefined4 local_f48;
  undefined4 local_f44;
  undefined4 local_f40;
  undefined4 local_f3c;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 *local_f28;
  undefined4 *local_f20;
  undefined4 *local_f18;
  undefined4 local_f0c;
  undefined4 local_f08;
  undefined4 local_f04;
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined4 local_ef4;
  undefined4 local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined4 local_edc;
  undefined4 local_ed8;
  undefined4 local_ed4;
  undefined4 local_ed0;
  undefined4 local_ecc;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined4 local_ebc;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  undefined4 local_eac;
  undefined4 *local_ea8;
  undefined4 *local_ea0;
  undefined4 *local_e98;
  undefined4 local_e90;
  undefined4 local_e8c;
  undefined4 local_e88;
  undefined4 local_e84;
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined4 local_e6c;
  undefined4 local_e68;
  undefined4 local_e64;
  undefined4 local_e60;
  undefined4 local_e5c;
  undefined4 local_e58;
  undefined4 local_e54;
  undefined4 local_e50;
  undefined4 local_e4c;
  undefined4 local_e48;
  undefined4 local_e44;
  undefined4 local_e40;
  undefined4 local_e3c;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 *local_e30;
  undefined4 *local_e28;
  undefined4 *local_e20;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined4 local_e00;
  undefined4 local_dfc;
  undefined4 local_df8;
  undefined4 local_df4;
  undefined4 local_df0;
  undefined4 local_dec;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined4 local_de0;
  undefined4 local_ddc;
  undefined4 local_dd8;
  undefined4 local_dd4;
  undefined4 local_dd0;
  undefined4 local_dcc;
  undefined4 local_dc8;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 *local_db8;
  undefined4 *local_db0;
  undefined4 *local_da8;
  undefined4 local_d9c;
  undefined4 local_d98;
  undefined4 local_d94;
  undefined4 local_d90;
  undefined4 local_d8c;
  undefined4 local_d88;
  undefined4 local_d84;
  undefined4 local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined4 local_d74;
  undefined4 local_d70;
  undefined4 local_d6c;
  undefined4 local_d68;
  undefined4 local_d64;
  undefined4 local_d60;
  undefined4 local_d5c;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined4 local_d44;
  undefined4 *local_d40;
  undefined4 *local_d38;
  undefined4 *local_d30;
  undefined4 local_d24;
  undefined4 local_d20;
  undefined4 local_d1c;
  undefined4 local_d18;
  undefined4 local_d14;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined4 local_d08;
  undefined4 local_d04;
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 *local_cc8;
  undefined4 *local_cc0;
  undefined4 *local_cb8;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  undefined4 local_c9c;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  undefined4 local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 *local_c58;
  undefined4 *local_c50;
  undefined4 *local_c48;
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined4 local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined4 *local_be8;
  undefined4 *local_be0;
  undefined4 *local_bd8;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 *local_b78;
  undefined4 *local_b70;
  undefined4 *local_b68;
  undefined4 local_b5c;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined4 *local_b08;
  undefined4 *local_b00;
  undefined4 *local_af8;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 *local_aa0;
  undefined4 *local_a98;
  undefined4 *local_a90;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 *local_a38;
  undefined4 *local_a30;
  undefined4 *local_a28;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 *local_9d0;
  undefined4 *local_9c8;
  undefined4 *local_9c0;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 *local_968;
  undefined4 *local_960;
  undefined4 *local_958;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 *local_908;
  undefined4 *local_900;
  undefined4 *local_8f8;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 *local_8a8;
  undefined4 *local_8a0;
  undefined4 *local_898;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 *local_848;
  undefined4 *local_840;
  undefined4 *local_838;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 *local_7e8;
  undefined4 *local_7e0;
  undefined4 *local_7d8;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 *local_790;
  undefined4 *local_788;
  undefined4 *local_780;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 *local_738;
  undefined4 *local_730;
  undefined4 *local_728;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_704;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined4 *local_6e0;
  undefined4 *local_6d8;
  undefined4 *local_6d0;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 *local_688;
  undefined4 *local_680;
  undefined4 *local_678;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 *local_638;
  undefined4 *local_630;
  undefined4 *local_628;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 *local_5e8;
  undefined4 *local_5e0;
  undefined4 *local_5d8;
  undefined4 local_5cc;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 *local_598;
  undefined4 *local_590;
  undefined4 *local_588;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 *local_548;
  undefined4 *local_540;
  undefined4 *local_538;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 *local_500;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 *local_4c8;
  undefined4 *local_4c0;
  undefined4 *local_4b8;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 *local_488;
  undefined4 *local_480;
  undefined4 *local_478;
  undefined4 *local_470;
  undefined4 *local_468;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 *local_438;
  undefined4 *local_430;
  undefined4 *local_428;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined4 *local_400;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 *local_3d8;
  undefined4 *local_3d0;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  undefined4 *local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 *local_398;
  undefined4 *local_390;
  undefined4 *local_388;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 *local_368;
  undefined4 *local_360;
  undefined4 *local_358;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 *local_340;
  undefined4 *local_338;
  undefined4 *local_330;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 *local_318;
  undefined4 *local_310;
  undefined4 *local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 *local_2f8;
  undefined4 *local_2f0;
  undefined4 *local_2e8;
  undefined4 local_2dc;
  undefined4 *local_2d8;
  undefined4 *local_2d0;
  undefined4 *local_2c8;
  undefined4 *local_2c0;
  undefined4 *local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 *local_280;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 *local_248;
  undefined4 *local_240;
  undefined4 *local_238;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 *local_208;
  undefined4 *local_200;
  undefined4 *local_1f8;
  undefined4 *local_1f0;
  undefined4 *local_1e8;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 *local_1b8;
  undefined4 *local_1b0;
  undefined4 *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 *local_180;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 *local_158;
  undefined4 *local_150;
  undefined4 *local_148;
  undefined4 *local_140;
  undefined4 *local_138;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 *local_118;
  undefined4 *local_110;
  undefined4 *local_108;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 *local_e8;
  undefined4 *local_e0;
  undefined4 *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  
  RVar4 = (RegGroup)((uint)in_stack_ffffffffffffe2d4 >> 0x18);
  local_1599 = *in_RDX;
  *in_RDI = local_1599;
  local_15c9 = 3;
  if (in_RDX[4] != '\x05') {
    local_15c9 = 0;
  }
  local_1581 = local_15c9;
  in_RDI[2] = local_15c9;
  local_1549 = 0;
  local_1550 = 8;
  local_15a9 = in_SIL;
  local_15a8 = in_RDI;
  puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,in_stack_ffffffffffffe278));
  *puVar2 = '\b';
  local_1558 = local_15a8;
  local_1559 = 1;
  local_1560 = 8;
  puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,in_stack_ffffffffffffe278));
  *puVar2 = '\b';
  local_1508 = local_15a8;
  local_1509 = 0;
  local_1510 = 0x10;
  puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,in_stack_ffffffffffffe278));
  *puVar2 = '\x10';
  local_1518 = local_15a8;
  local_1519 = 1;
  local_1520 = 0x10;
  puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,in_stack_ffffffffffffe278));
  *puVar2 = '\x10';
  local_1528 = local_15a8;
  local_1529 = 2;
  local_1530 = 1;
  puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,in_stack_ffffffffffffe278));
  *puVar2 = '\x01';
  local_1538 = local_15a8;
  local_1539 = 3;
  local_1540 = 1;
  puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     ((Array<unsigned_char,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                      (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,in_stack_ffffffffffffe278));
  *puVar2 = '\x01';
  CallConv::setPassedOrder
            ((CallConv *)CONCAT44(in_stack_ffffffffffffe2dc,in_stack_ffffffffffffe2d8),RVar4,
             in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2cc,in_stack_ffffffffffffe2c8,
             in_stack_ffffffffffffe2c4,in_stack_ffffffffffffe310,in_stack_ffffffffffffe318,
             in_stack_ffffffffffffe320,in_stack_ffffffffffffe328);
  uVar3 = 4;
  regs = 5;
  uVar5 = 6;
  CallConv::setPassedOrder
            ((CallConv *)CONCAT44(in_stack_ffffffffffffe2dc,in_stack_ffffffffffffe2d8),RVar4,
             in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2cc,in_stack_ffffffffffffe2c8,
             in_stack_ffffffffffffe2c4,in_stack_ffffffffffffe310,in_stack_ffffffffffffe318,
             in_stack_ffffffffffffe320,in_stack_ffffffffffffe328);
  local_14f8 = local_15a8;
  local_14fc = 0x10;
  local_15a8[5] = 0x10;
  bVar1 = shouldTreatAsCDecl(local_15a9);
  if (bVar1) {
    local_14d8 = local_15a8;
    local_14d9 = 0;
    local_15a8[1] = 0;
    local_15bc[0] = 0x12;
    local_14a0 = local_15bc;
    local_14a4 = 0x13;
    local_14a8 = 0x14;
    local_14ac = 0x15;
    local_14b0 = 0x16;
    local_14b4 = 0x17;
    local_14b8 = 0x18;
    local_14bc = 0x19;
    local_14c0 = 0x1a;
    local_14c4 = 0x1b;
    local_14c8 = 0x1c;
    local_14cc = 0x1d;
    local_14d0 = 0x1e;
    local_12e0 = &local_14a4;
    local_12e4 = 0x14;
    local_12e8 = 0x15;
    local_12ec = 0x16;
    local_12f0 = 0x17;
    local_12f4 = 0x18;
    local_12f8 = 0x19;
    local_12fc = 0x1a;
    local_1300 = 0x1b;
    local_1304 = 0x1c;
    local_1308 = 0x1d;
    local_130c = 0x1e;
    local_1280 = &local_12e4;
    local_1284 = 0x15;
    local_1288 = 0x16;
    local_128c = 0x17;
    local_1290 = 0x18;
    local_1294 = 0x19;
    local_1298 = 0x1a;
    local_129c = 0x1b;
    local_12a0 = 0x1c;
    local_12a4 = 0x1d;
    local_12a8 = 0x1e;
    local_1218 = &local_1284;
    local_121c = 0x16;
    local_1220 = 0x17;
    local_1224 = 0x18;
    local_1228 = 0x19;
    local_122c = 0x1a;
    local_1230 = 0x1b;
    local_1234 = 0x1c;
    local_1238 = 0x1d;
    local_123c = 0x1e;
    local_11e0 = &local_121c;
    local_11e4 = 0x17;
    local_11e8 = 0x18;
    local_11ec = 0x19;
    local_11f0 = 0x1a;
    local_11f4 = 0x1b;
    local_11f8 = 0x1c;
    local_11fc = 0x1d;
    local_1200 = 0x1e;
    local_11b8 = &local_11e4;
    local_11bc = 0x18;
    local_11c0 = 0x19;
    local_11c4 = 0x1a;
    local_11c8 = 0x1b;
    local_11cc = 0x1c;
    local_11d0 = 0x1d;
    local_11d4 = 0x1e;
    local_1178 = &local_11bc;
    local_117c = 0x19;
    local_1180 = 0x1a;
    local_1184 = 0x1b;
    local_1188 = 0x1c;
    local_118c = 0x1d;
    local_1190 = 0x1e;
    local_10e8 = &local_117c;
    local_10ec = 0x1a;
    local_10f0 = 0x1b;
    local_10f4 = 0x1c;
    local_10f8 = 0x1d;
    local_10fc = 0x1e;
    local_10c0 = &local_10ec;
    local_10c4 = 0x1b;
    local_10c8 = 0x1c;
    local_10cc = 0x1d;
    local_10d0 = 0x1e;
    local_1048 = &local_10c4;
    local_104c = 0x1c;
    local_1050 = 0x1d;
    local_1054 = 0x1e;
    local_1028 = &local_104c;
    local_102c = 0x1d;
    local_1030 = 0x1e;
    local_fb8 = &local_102c;
    local_fbc = 0x1e;
    local_fb0 = &local_fbc;
    local_1318 = local_14a0;
    local_12d8 = local_14a0;
    local_12d0 = local_12e0;
    local_1278 = local_1280;
    local_1270 = local_1280;
    local_1248 = local_12e0;
    local_1210 = local_1218;
    local_1208 = local_1218;
    local_11b0 = local_11b8;
    local_11a8 = local_11e0;
    local_11a0 = local_11e0;
    local_1198 = local_11b8;
    local_1170 = local_1178;
    local_1168 = local_1178;
    local_10e0 = local_10e8;
    local_10d8 = local_10e8;
    local_10b8 = local_10c0;
    local_10b0 = local_10c0;
    local_1040 = local_1048;
    local_1038 = local_1048;
    local_1020 = local_1028;
    local_1018 = local_1028;
    local_fa8 = local_fb8;
    local_fa0 = local_fb8;
    local_f98 = local_fb0;
    CallConv::setPreservedRegs
              ((CallConv *)CONCAT44(in_stack_ffffffffffffe28c,uVar5),
               (RegGroup)((uint)in_stack_ffffffffffffe284 >> 0x18),regs);
    local_15c0 = 8;
    local_1478 = &local_15c0;
    local_147c = 9;
    local_1480 = 10;
    local_1484 = 0xb;
    local_1488 = 0xc;
    local_148c = 0xd;
    local_1490 = 0xe;
    local_1494 = 0xf;
    local_1148 = &local_147c;
    local_114c = 10;
    local_1150 = 0xb;
    local_1154 = 0xc;
    local_1158 = 0xd;
    local_115c = 0xe;
    local_1160 = 0xf;
    local_1118 = &local_114c;
    local_111c = 0xb;
    local_1120 = 0xc;
    local_1124 = 0xd;
    local_1128 = 0xe;
    local_112c = 0xf;
    local_1098 = &local_111c;
    local_109c = 0xc;
    local_10a0 = 0xd;
    local_10a4 = 0xe;
    local_10a8 = 0xf;
    local_1070 = &local_109c;
    local_1074 = 0xd;
    local_1078 = 0xe;
    local_107c = 0xf;
    local_1008 = &local_1074;
    local_100c = 0xe;
    local_1010 = 0xf;
    local_fe8 = &local_100c;
    local_fec = 0xf;
    local_fe0 = &local_fec;
    local_12b0 = local_1478;
    local_1268 = local_1478;
    local_1140 = local_1148;
    local_1138 = local_1148;
    local_1110 = local_1118;
    local_1108 = local_1118;
    local_1090 = local_1098;
    local_1088 = local_1098;
    local_1068 = local_1070;
    local_1060 = local_1070;
    local_1000 = local_1008;
    local_ff8 = local_1008;
    local_fd8 = local_fe8;
    local_fd0 = local_fe8;
    local_fc8 = local_fe0;
    CallConv::setPreservedRegs
              ((CallConv *)CONCAT44(in_stack_ffffffffffffe28c,uVar5),
               (RegGroup)((uint)in_stack_ffffffffffffe284 >> 0x18),regs);
  }
  else {
    local_14e8 = local_15a8;
    local_14e9 = local_15a9;
    local_15a8[1] = local_15a9;
    local_1568 = local_15a8;
    local_1569 = 1;
    local_1570 = 0x10;
    puVar2 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_char,_4UL> *)CONCAT44(in_stack_ffffffffffffe284,regs),
                        (RegGroup *)CONCAT44(in_stack_ffffffffffffe27c,uVar3));
    *puVar2 = '\x10';
    local_15c4 = 4;
    local_1408 = &local_15c4;
    local_140c = 5;
    local_1410 = 6;
    local_1414 = 7;
    local_1418 = 8;
    local_141c = 9;
    local_1420 = 10;
    local_1424 = 0xb;
    local_1428 = 0xc;
    local_142c = 0xd;
    local_1430 = 0xe;
    local_1434 = 0xf;
    local_1438 = 0x10;
    local_143c = 0x11;
    local_1440 = 0x12;
    local_1444 = 0x13;
    local_1448 = 0x14;
    local_144c = 0x15;
    local_1450 = 0x16;
    local_1454 = 0x17;
    local_1458 = 0x18;
    local_145c = 0x19;
    local_1460 = 0x1a;
    local_1464 = 0x1b;
    local_1468 = 0x1c;
    local_146c = 0x1d;
    local_1470 = 0x1e;
    local_ea8 = &local_140c;
    local_eac = 6;
    local_eb0 = 7;
    local_eb4 = 8;
    local_eb8 = 9;
    local_ebc = 10;
    local_ec0 = 0xb;
    local_ec4 = 0xc;
    local_ec8 = 0xd;
    local_ecc = 0xe;
    local_ed0 = 0xf;
    local_ed4 = 0x10;
    local_ed8 = 0x11;
    local_edc = 0x12;
    local_ee0 = 0x13;
    local_ee4 = 0x14;
    local_ee8 = 0x15;
    local_eec = 0x16;
    local_ef0 = 0x17;
    local_ef4 = 0x18;
    local_ef8 = 0x19;
    local_efc = 0x1a;
    local_f00 = 0x1b;
    local_f04 = 0x1c;
    local_f08 = 0x1d;
    local_f0c = 0x1e;
    local_e30 = &local_eac;
    local_e34 = 7;
    local_e38 = 8;
    local_e3c = 9;
    local_e40 = 10;
    local_e44 = 0xb;
    local_e48 = 0xc;
    local_e4c = 0xd;
    local_e50 = 0xe;
    local_e54 = 0xf;
    local_e58 = 0x10;
    local_e5c = 0x11;
    local_e60 = 0x12;
    local_e64 = 0x13;
    local_e68 = 0x14;
    local_e6c = 0x15;
    local_e70 = 0x16;
    local_e74 = 0x17;
    local_e78 = 0x18;
    local_e7c = 0x19;
    local_e80 = 0x1a;
    local_e84 = 0x1b;
    local_e88 = 0x1c;
    local_e8c = 0x1d;
    local_e90 = 0x1e;
    local_cc8 = &local_e34;
    local_ccc = 8;
    local_cd0 = 9;
    local_cd4 = 10;
    local_cd8 = 0xb;
    local_cdc = 0xc;
    local_ce0 = 0xd;
    local_ce4 = 0xe;
    local_ce8 = 0xf;
    local_cec = 0x10;
    local_cf0 = 0x11;
    local_cf4 = 0x12;
    local_cf8 = 0x13;
    local_cfc = 0x14;
    local_d00 = 0x15;
    local_d04 = 0x16;
    local_d08 = 0x17;
    local_d0c = 0x18;
    local_d10 = 0x19;
    local_d14 = 0x1a;
    local_d18 = 0x1b;
    local_d1c = 0x1c;
    local_d20 = 0x1d;
    local_d24 = 0x1e;
    local_c58 = &local_ccc;
    local_c5c = 9;
    local_c60 = 10;
    local_c64 = 0xb;
    local_c68 = 0xc;
    local_c6c = 0xd;
    local_c70 = 0xe;
    local_c74 = 0xf;
    local_c78 = 0x10;
    local_c7c = 0x11;
    local_c80 = 0x12;
    local_c84 = 0x13;
    local_c88 = 0x14;
    local_c8c = 0x15;
    local_c90 = 0x16;
    local_c94 = 0x17;
    local_c98 = 0x18;
    local_c9c = 0x19;
    local_ca0 = 0x1a;
    local_ca4 = 0x1b;
    local_ca8 = 0x1c;
    local_cac = 0x1d;
    local_cb0 = 0x1e;
    local_b08 = &local_c5c;
    local_b0c = 10;
    local_b10 = 0xb;
    local_b14 = 0xc;
    local_b18 = 0xd;
    local_b1c = 0xe;
    local_b20 = 0xf;
    local_b24 = 0x10;
    local_b28 = 0x11;
    local_b2c = 0x12;
    local_b30 = 0x13;
    local_b34 = 0x14;
    local_b38 = 0x15;
    local_b3c = 0x16;
    local_b40 = 0x17;
    local_b44 = 0x18;
    local_b48 = 0x19;
    local_b4c = 0x1a;
    local_b50 = 0x1b;
    local_b54 = 0x1c;
    local_b58 = 0x1d;
    local_b5c = 0x1e;
    local_aa0 = &local_b0c;
    local_aa4 = 0xb;
    local_aa8 = 0xc;
    local_aac = 0xd;
    local_ab0 = 0xe;
    local_ab4 = 0xf;
    local_ab8 = 0x10;
    local_abc = 0x11;
    local_ac0 = 0x12;
    local_ac4 = 0x13;
    local_ac8 = 0x14;
    local_acc = 0x15;
    local_ad0 = 0x16;
    local_ad4 = 0x17;
    local_ad8 = 0x18;
    local_adc = 0x19;
    local_ae0 = 0x1a;
    local_ae4 = 0x1b;
    local_ae8 = 0x1c;
    local_aec = 0x1d;
    local_af0 = 0x1e;
    local_968 = &local_aa4;
    local_96c = 0xc;
    local_970 = 0xd;
    local_974 = 0xe;
    local_978 = 0xf;
    local_97c = 0x10;
    local_980 = 0x11;
    local_984 = 0x12;
    local_988 = 0x13;
    local_98c = 0x14;
    local_990 = 0x15;
    local_994 = 0x16;
    local_998 = 0x17;
    local_99c = 0x18;
    local_9a0 = 0x19;
    local_9a4 = 0x1a;
    local_9a8 = 0x1b;
    local_9ac = 0x1c;
    local_9b0 = 0x1d;
    local_9b4 = 0x1e;
    local_908 = &local_96c;
    local_90c = 0xd;
    local_910 = 0xe;
    local_914 = 0xf;
    local_918 = 0x10;
    local_91c = 0x11;
    local_920 = 0x12;
    local_924 = 0x13;
    local_928 = 0x14;
    local_92c = 0x15;
    local_930 = 0x16;
    local_934 = 0x17;
    local_938 = 0x18;
    local_93c = 0x19;
    local_940 = 0x1a;
    local_944 = 0x1b;
    local_948 = 0x1c;
    local_94c = 0x1d;
    local_950 = 0x1e;
    local_7e8 = &local_90c;
    local_7ec = 0xe;
    local_7f0 = 0xf;
    local_7f4 = 0x10;
    local_7f8 = 0x11;
    local_7fc = 0x12;
    local_800 = 0x13;
    local_804 = 0x14;
    local_808 = 0x15;
    local_80c = 0x16;
    local_810 = 0x17;
    local_814 = 0x18;
    local_818 = 0x19;
    local_81c = 0x1a;
    local_820 = 0x1b;
    local_824 = 0x1c;
    local_828 = 0x1d;
    local_82c = 0x1e;
    local_790 = &local_7ec;
    local_794 = 0xf;
    local_798 = 0x10;
    local_79c = 0x11;
    local_7a0 = 0x12;
    local_7a4 = 0x13;
    local_7a8 = 0x14;
    local_7ac = 0x15;
    local_7b0 = 0x16;
    local_7b4 = 0x17;
    local_7b8 = 0x18;
    local_7bc = 0x19;
    local_7c0 = 0x1a;
    local_7c4 = 0x1b;
    local_7c8 = 0x1c;
    local_7cc = 0x1d;
    local_7d0 = 0x1e;
    local_688 = &local_794;
    local_68c = 0x10;
    local_690 = 0x11;
    local_694 = 0x12;
    local_698 = 0x13;
    local_69c = 0x14;
    local_6a0 = 0x15;
    local_6a4 = 0x16;
    local_6a8 = 0x17;
    local_6ac = 0x18;
    local_6b0 = 0x19;
    local_6b4 = 0x1a;
    local_6b8 = 0x1b;
    local_6bc = 0x1c;
    local_6c0 = 0x1d;
    local_6c4 = 0x1e;
    local_638 = &local_68c;
    local_63c = 0x11;
    local_640 = 0x12;
    local_644 = 0x13;
    local_648 = 0x14;
    local_64c = 0x15;
    local_650 = 0x16;
    local_654 = 0x17;
    local_658 = 0x18;
    local_65c = 0x19;
    local_660 = 0x1a;
    local_664 = 0x1b;
    local_668 = 0x1c;
    local_66c = 0x1d;
    local_670 = 0x1e;
    local_548 = &local_63c;
    local_54c = 0x12;
    local_550 = 0x13;
    local_554 = 0x14;
    local_558 = 0x15;
    local_55c = 0x16;
    local_560 = 0x17;
    local_564 = 0x18;
    local_568 = 0x19;
    local_56c = 0x1a;
    local_570 = 0x1b;
    local_574 = 0x1c;
    local_578 = 0x1d;
    local_57c = 0x1e;
    local_500 = &local_54c;
    local_504 = 0x13;
    local_508 = 0x14;
    local_50c = 0x15;
    local_510 = 0x16;
    local_514 = 0x17;
    local_518 = 0x18;
    local_51c = 0x19;
    local_520 = 0x1a;
    local_524 = 0x1b;
    local_528 = 0x1c;
    local_52c = 0x1d;
    local_530 = 0x1e;
    local_4c8 = &local_504;
    local_4cc = 0x14;
    local_4d0 = 0x15;
    local_4d4 = 0x16;
    local_4d8 = 0x17;
    local_4dc = 0x18;
    local_4e0 = 0x19;
    local_4e4 = 0x1a;
    local_4e8 = 0x1b;
    local_4ec = 0x1c;
    local_4f0 = 0x1d;
    local_4f4 = 0x1e;
    local_488 = &local_4cc;
    local_48c = 0x15;
    local_490 = 0x16;
    local_494 = 0x17;
    local_498 = 0x18;
    local_49c = 0x19;
    local_4a0 = 0x1a;
    local_4a4 = 0x1b;
    local_4a8 = 0x1c;
    local_4ac = 0x1d;
    local_4b0 = 0x1e;
    local_438 = &local_48c;
    local_43c = 0x16;
    local_440 = 0x17;
    local_444 = 0x18;
    local_448 = 0x19;
    local_44c = 0x1a;
    local_450 = 0x1b;
    local_454 = 0x1c;
    local_458 = 0x1d;
    local_45c = 0x1e;
    local_400 = &local_43c;
    local_404 = 0x17;
    local_408 = 0x18;
    local_40c = 0x19;
    local_410 = 0x1a;
    local_414 = 0x1b;
    local_418 = 0x1c;
    local_41c = 0x1d;
    local_420 = 0x1e;
    local_3d8 = &local_404;
    local_3dc = 0x18;
    local_3e0 = 0x19;
    local_3e4 = 0x1a;
    local_3e8 = 0x1b;
    local_3ec = 0x1c;
    local_3f0 = 0x1d;
    local_3f4 = 0x1e;
    local_398 = &local_3dc;
    local_39c = 0x19;
    local_3a0 = 0x1a;
    local_3a4 = 0x1b;
    local_3a8 = 0x1c;
    local_3ac = 0x1d;
    local_3b0 = 0x1e;
    local_368 = &local_39c;
    local_36c = 0x1a;
    local_370 = 0x1b;
    local_374 = 0x1c;
    local_378 = 0x1d;
    local_37c = 0x1e;
    local_340 = &local_36c;
    local_344 = 0x1b;
    local_348 = 0x1c;
    local_34c = 0x1d;
    local_350 = 0x1e;
    local_318 = &local_344;
    local_31c = 0x1c;
    local_320 = 0x1d;
    local_324 = 0x1e;
    local_2f8 = &local_31c;
    local_2fc = 0x1d;
    local_300 = 0x1e;
    local_2d8 = &local_2fc;
    local_2dc = 0x1e;
    local_2d0 = &local_2dc;
    RVar4 = (RegGroup)((uint)in_stack_ffffffffffffe284 >> 0x18);
    local_12b8 = local_1408;
    local_1260 = local_1408;
    local_ea0 = local_ea8;
    local_e98 = local_ea8;
    local_e28 = local_e30;
    local_e20 = local_e30;
    local_cc0 = local_cc8;
    local_cb8 = local_cc8;
    local_c50 = local_c58;
    local_c48 = local_c58;
    local_b00 = local_b08;
    local_af8 = local_b08;
    local_a98 = local_aa0;
    local_a90 = local_aa0;
    local_960 = local_968;
    local_958 = local_968;
    local_900 = local_908;
    local_8f8 = local_908;
    local_7e0 = local_7e8;
    local_7d8 = local_7e8;
    local_788 = local_790;
    local_780 = local_790;
    local_680 = local_688;
    local_678 = local_688;
    local_630 = local_638;
    local_628 = local_638;
    local_540 = local_548;
    local_538 = local_548;
    local_4c0 = local_4c8;
    local_4b8 = local_500;
    local_480 = local_488;
    local_478 = local_488;
    local_470 = local_500;
    local_468 = local_4c8;
    local_430 = local_438;
    local_428 = local_438;
    local_3d0 = local_3d8;
    local_3c8 = local_400;
    local_3c0 = local_400;
    local_3b8 = local_3d8;
    local_390 = local_398;
    local_388 = local_398;
    local_360 = local_368;
    local_358 = local_368;
    local_338 = local_340;
    local_330 = local_340;
    local_310 = local_318;
    local_308 = local_318;
    local_2f0 = local_2f8;
    local_2e8 = local_2f8;
    local_2c8 = local_2d8;
    local_2c0 = local_2d8;
    local_2b8 = local_2d0;
    CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_ffffffffffffe28c,uVar5),RVar4,regs);
    local_15c8 = 4;
    local_1390 = &local_15c8;
    local_1394 = 5;
    local_1398 = 6;
    local_139c = 7;
    local_13a0 = 8;
    local_13a4 = 9;
    local_13a8 = 10;
    local_13ac = 0xb;
    local_13b0 = 0xc;
    local_13b4 = 0xd;
    local_13b8 = 0xe;
    local_13bc = 0xf;
    local_13c0 = 0x10;
    local_13c4 = 0x11;
    local_13c8 = 0x12;
    local_13cc = 0x13;
    local_13d0 = 0x14;
    local_13d4 = 0x15;
    local_13d8 = 0x16;
    local_13dc = 0x17;
    local_13e0 = 0x18;
    local_13e4 = 0x19;
    local_13e8 = 0x1a;
    local_13ec = 0x1b;
    local_13f0 = 0x1c;
    local_13f4 = 0x1d;
    local_13f8 = 0x1e;
    local_13fc = 0x1f;
    local_1320 = &local_1394;
    local_1324 = 6;
    local_1328 = 7;
    local_132c = 8;
    local_1330 = 9;
    local_1334 = 10;
    local_1338 = 0xb;
    local_133c = 0xc;
    local_1340 = 0xd;
    local_1344 = 0xe;
    local_1348 = 0xf;
    local_134c = 0x10;
    local_1350 = 0x11;
    local_1354 = 0x12;
    local_1358 = 0x13;
    local_135c = 0x14;
    local_1360 = 0x15;
    local_1364 = 0x16;
    local_1368 = 0x17;
    local_136c = 0x18;
    local_1370 = 0x19;
    local_1374 = 0x1a;
    local_1378 = 0x1b;
    local_137c = 0x1c;
    local_1380 = 0x1d;
    local_1384 = 0x1e;
    local_1388 = 0x1f;
    local_f28 = &local_1324;
    local_f2c = 7;
    local_f30 = 8;
    local_f34 = 9;
    local_f38 = 10;
    local_f3c = 0xb;
    local_f40 = 0xc;
    local_f44 = 0xd;
    local_f48 = 0xe;
    local_f4c = 0xf;
    local_f50 = 0x10;
    local_f54 = 0x11;
    local_f58 = 0x12;
    local_f5c = 0x13;
    local_f60 = 0x14;
    local_f64 = 0x15;
    local_f68 = 0x16;
    local_f6c = 0x17;
    local_f70 = 0x18;
    local_f74 = 0x19;
    local_f78 = 0x1a;
    local_f7c = 0x1b;
    local_f80 = 0x1c;
    local_f84 = 0x1d;
    local_f88 = 0x1e;
    local_f8c = 0x1f;
    local_db8 = &local_f2c;
    local_dbc = 8;
    local_dc0 = 9;
    local_dc4 = 10;
    local_dc8 = 0xb;
    local_dcc = 0xc;
    local_dd0 = 0xd;
    local_dd4 = 0xe;
    local_dd8 = 0xf;
    local_ddc = 0x10;
    local_de0 = 0x11;
    local_de4 = 0x12;
    local_de8 = 0x13;
    local_dec = 0x14;
    local_df0 = 0x15;
    local_df4 = 0x16;
    local_df8 = 0x17;
    local_dfc = 0x18;
    local_e00 = 0x19;
    local_e04 = 0x1a;
    local_e08 = 0x1b;
    local_e0c = 0x1c;
    local_e10 = 0x1d;
    local_e14 = 0x1e;
    local_e18 = 0x1f;
    local_d40 = &local_dbc;
    local_d44 = 9;
    local_d48 = 10;
    local_d4c = 0xb;
    local_d50 = 0xc;
    local_d54 = 0xd;
    local_d58 = 0xe;
    local_d5c = 0xf;
    local_d60 = 0x10;
    local_d64 = 0x11;
    local_d68 = 0x12;
    local_d6c = 0x13;
    local_d70 = 0x14;
    local_d74 = 0x15;
    local_d78 = 0x16;
    local_d7c = 0x17;
    local_d80 = 0x18;
    local_d84 = 0x19;
    local_d88 = 0x1a;
    local_d8c = 0x1b;
    local_d90 = 0x1c;
    local_d94 = 0x1d;
    local_d98 = 0x1e;
    local_d9c = 0x1f;
    local_be8 = &local_d44;
    local_bec = 10;
    local_bf0 = 0xb;
    local_bf4 = 0xc;
    local_bf8 = 0xd;
    local_bfc = 0xe;
    local_c00 = 0xf;
    local_c04 = 0x10;
    local_c08 = 0x11;
    local_c0c = 0x12;
    local_c10 = 0x13;
    local_c14 = 0x14;
    local_c18 = 0x15;
    local_c1c = 0x16;
    local_c20 = 0x17;
    local_c24 = 0x18;
    local_c28 = 0x19;
    local_c2c = 0x1a;
    local_c30 = 0x1b;
    local_c34 = 0x1c;
    local_c38 = 0x1d;
    local_c3c = 0x1e;
    local_c40 = 0x1f;
    local_b78 = &local_bec;
    local_b7c = 0xb;
    local_b80 = 0xc;
    local_b84 = 0xd;
    local_b88 = 0xe;
    local_b8c = 0xf;
    local_b90 = 0x10;
    local_b94 = 0x11;
    local_b98 = 0x12;
    local_b9c = 0x13;
    local_ba0 = 0x14;
    local_ba4 = 0x15;
    local_ba8 = 0x16;
    local_bac = 0x17;
    local_bb0 = 0x18;
    local_bb4 = 0x19;
    local_bb8 = 0x1a;
    local_bbc = 0x1b;
    local_bc0 = 0x1c;
    local_bc4 = 0x1d;
    local_bc8 = 0x1e;
    local_bcc = 0x1f;
    local_a38 = &local_b7c;
    local_a3c = 0xc;
    local_a40 = 0xd;
    local_a44 = 0xe;
    local_a48 = 0xf;
    local_a4c = 0x10;
    local_a50 = 0x11;
    local_a54 = 0x12;
    local_a58 = 0x13;
    local_a5c = 0x14;
    local_a60 = 0x15;
    local_a64 = 0x16;
    local_a68 = 0x17;
    local_a6c = 0x18;
    local_a70 = 0x19;
    local_a74 = 0x1a;
    local_a78 = 0x1b;
    local_a7c = 0x1c;
    local_a80 = 0x1d;
    local_a84 = 0x1e;
    local_a88 = 0x1f;
    local_9d0 = &local_a3c;
    local_9d4 = 0xd;
    local_9d8 = 0xe;
    local_9dc = 0xf;
    local_9e0 = 0x10;
    local_9e4 = 0x11;
    local_9e8 = 0x12;
    local_9ec = 0x13;
    local_9f0 = 0x14;
    local_9f4 = 0x15;
    local_9f8 = 0x16;
    local_9fc = 0x17;
    local_a00 = 0x18;
    local_a04 = 0x19;
    local_a08 = 0x1a;
    local_a0c = 0x1b;
    local_a10 = 0x1c;
    local_a14 = 0x1d;
    local_a18 = 0x1e;
    local_a1c = 0x1f;
    local_8a8 = &local_9d4;
    local_8ac = 0xe;
    local_8b0 = 0xf;
    local_8b4 = 0x10;
    local_8b8 = 0x11;
    local_8bc = 0x12;
    local_8c0 = 0x13;
    local_8c4 = 0x14;
    local_8c8 = 0x15;
    local_8cc = 0x16;
    local_8d0 = 0x17;
    local_8d4 = 0x18;
    local_8d8 = 0x19;
    local_8dc = 0x1a;
    local_8e0 = 0x1b;
    local_8e4 = 0x1c;
    local_8e8 = 0x1d;
    local_8ec = 0x1e;
    local_8f0 = 0x1f;
    local_848 = &local_8ac;
    local_84c = 0xf;
    local_850 = 0x10;
    local_854 = 0x11;
    local_858 = 0x12;
    local_85c = 0x13;
    local_860 = 0x14;
    local_864 = 0x15;
    local_868 = 0x16;
    local_86c = 0x17;
    local_870 = 0x18;
    local_874 = 0x19;
    local_878 = 0x1a;
    local_87c = 0x1b;
    local_880 = 0x1c;
    local_884 = 0x1d;
    local_888 = 0x1e;
    local_88c = 0x1f;
    local_738 = &local_84c;
    local_73c = 0x10;
    local_740 = 0x11;
    local_744 = 0x12;
    local_748 = 0x13;
    local_74c = 0x14;
    local_750 = 0x15;
    local_754 = 0x16;
    local_758 = 0x17;
    local_75c = 0x18;
    local_760 = 0x19;
    local_764 = 0x1a;
    local_768 = 0x1b;
    local_76c = 0x1c;
    local_770 = 0x1d;
    local_774 = 0x1e;
    local_778 = 0x1f;
    local_6e0 = &local_73c;
    local_6e4 = 0x11;
    local_6e8 = 0x12;
    local_6ec = 0x13;
    local_6f0 = 0x14;
    local_6f4 = 0x15;
    local_6f8 = 0x16;
    local_6fc = 0x17;
    local_700 = 0x18;
    local_704 = 0x19;
    local_708 = 0x1a;
    local_70c = 0x1b;
    local_710 = 0x1c;
    local_714 = 0x1d;
    local_718 = 0x1e;
    local_71c = 0x1f;
    local_5e8 = &local_6e4;
    local_5ec = 0x12;
    local_5f0 = 0x13;
    local_5f4 = 0x14;
    local_5f8 = 0x15;
    local_5fc = 0x16;
    local_600 = 0x17;
    local_604 = 0x18;
    local_608 = 0x19;
    local_60c = 0x1a;
    local_610 = 0x1b;
    local_614 = 0x1c;
    local_618 = 0x1d;
    local_61c = 0x1e;
    local_620 = 0x1f;
    local_598 = &local_5ec;
    local_59c = 0x13;
    local_5a0 = 0x14;
    local_5a4 = 0x15;
    local_5a8 = 0x16;
    local_5ac = 0x17;
    local_5b0 = 0x18;
    local_5b4 = 0x19;
    local_5b8 = 0x1a;
    local_5bc = 0x1b;
    local_5c0 = 0x1c;
    local_5c4 = 0x1d;
    local_5c8 = 0x1e;
    local_5cc = 0x1f;
    local_280 = &local_59c;
    local_284 = 0x14;
    local_288 = 0x15;
    local_28c = 0x16;
    local_290 = 0x17;
    local_294 = 0x18;
    local_298 = 0x19;
    local_29c = 0x1a;
    local_2a0 = 0x1b;
    local_2a4 = 0x1c;
    local_2a8 = 0x1d;
    local_2ac = 0x1e;
    local_2b0 = 0x1f;
    local_248 = &local_284;
    local_24c = 0x15;
    local_250 = 0x16;
    local_254 = 0x17;
    local_258 = 0x18;
    local_25c = 0x19;
    local_260 = 0x1a;
    local_264 = 0x1b;
    local_268 = 0x1c;
    local_26c = 0x1d;
    local_270 = 0x1e;
    local_274 = 0x1f;
    local_208 = &local_24c;
    local_20c = 0x16;
    local_210 = 0x17;
    local_214 = 0x18;
    local_218 = 0x19;
    local_21c = 0x1a;
    local_220 = 0x1b;
    local_224 = 0x1c;
    local_228 = 0x1d;
    local_22c = 0x1e;
    local_230 = 0x1f;
    local_1b8 = &local_20c;
    local_1bc = 0x17;
    local_1c0 = 0x18;
    local_1c4 = 0x19;
    local_1c8 = 0x1a;
    local_1cc = 0x1b;
    local_1d0 = 0x1c;
    local_1d4 = 0x1d;
    local_1d8 = 0x1e;
    local_1dc = 0x1f;
    local_180 = &local_1bc;
    local_184 = 0x18;
    local_188 = 0x19;
    local_18c = 0x1a;
    local_190 = 0x1b;
    local_194 = 0x1c;
    local_198 = 0x1d;
    local_19c = 0x1e;
    local_1a0 = 0x1f;
    local_158 = &local_184;
    local_15c = 0x19;
    local_160 = 0x1a;
    local_164 = 0x1b;
    local_168 = 0x1c;
    local_16c = 0x1d;
    local_170 = 0x1e;
    local_174 = 0x1f;
    local_118 = &local_15c;
    local_11c = 0x1a;
    local_120 = 0x1b;
    local_124 = 0x1c;
    local_128 = 0x1d;
    local_12c = 0x1e;
    local_130 = 0x1f;
    local_e8 = &local_11c;
    local_ec = 0x1b;
    local_f0 = 0x1c;
    local_f4 = 0x1d;
    local_f8 = 0x1e;
    local_fc = 0x1f;
    local_c0 = &local_ec;
    local_c4 = 0x1c;
    local_c8 = 0x1d;
    local_cc = 0x1e;
    local_d0 = 0x1f;
    local_98 = &local_c4;
    local_9c = 0x1d;
    local_a0 = 0x1e;
    local_a4 = 0x1f;
    local_78 = &local_9c;
    local_7c = 0x1e;
    local_80 = 0x1f;
    local_58 = &local_7c;
    local_5c = 0x1f;
    local_50 = &local_5c;
    local_12c8 = local_1320;
    local_12c0 = local_1390;
    local_1258 = local_1390;
    local_1250 = local_1320;
    local_f20 = local_f28;
    local_f18 = local_f28;
    local_db0 = local_db8;
    local_da8 = local_db8;
    local_d38 = local_d40;
    local_d30 = local_d40;
    local_be0 = local_be8;
    local_bd8 = local_be8;
    local_b70 = local_b78;
    local_b68 = local_b78;
    local_a30 = local_a38;
    local_a28 = local_a38;
    local_9c8 = local_9d0;
    local_9c0 = local_9d0;
    local_8a0 = local_8a8;
    local_898 = local_8a8;
    local_840 = local_848;
    local_838 = local_848;
    local_730 = local_738;
    local_728 = local_738;
    local_6d8 = local_6e0;
    local_6d0 = local_6e0;
    local_5e0 = local_5e8;
    local_5d8 = local_5e8;
    local_590 = local_598;
    local_588 = local_598;
    local_240 = local_248;
    local_238 = local_280;
    local_200 = local_208;
    local_1f8 = local_208;
    local_1f0 = local_280;
    local_1e8 = local_248;
    local_1b0 = local_1b8;
    local_1a8 = local_1b8;
    local_150 = local_158;
    local_148 = local_180;
    local_140 = local_180;
    local_138 = local_158;
    local_110 = local_118;
    local_108 = local_118;
    local_e0 = local_e8;
    local_d8 = local_e8;
    local_b8 = local_c0;
    local_b0 = local_c0;
    local_90 = local_98;
    local_88 = local_98;
    local_70 = local_78;
    local_68 = local_78;
    local_48 = local_58;
    local_40 = local_58;
    local_38 = local_50;
    CallConv::setPreservedRegs((CallConv *)CONCAT44(in_stack_ffffffffffffe28c,uVar5),RVar4,regs);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  cc.setArch(environment.arch());
  cc.setStrategy(environment.isDarwin() ? CallConvStrategy::kAArch64Apple : CallConvStrategy::kDefault);

  cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
  cc.setSaveRestoreRegSize(RegGroup::kVec, 8);
  cc.setSaveRestoreAlignment(RegGroup::kGp, 16);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kMask, 1);
  cc.setSaveRestoreAlignment(RegGroup::kExtraVirt3, 1);
  cc.setPassedOrder(RegGroup::kGp, 0, 1, 2, 3, 4, 5, 6, 7);
  cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
  cc.setNaturalStackAlignment(16);

  if (shouldTreatAsCDecl(ccId)) {
    // ARM doesn't have that many calling conventions as we can find in X86 world, treat most conventions as __cdecl.
    cc.setId(CallConvId::kCDecl);
    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdOs, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30));
    cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(8, 9, 10, 11, 12, 13, 14, 15));
  }
  else {
    cc.setId(ccId);
    cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30));
    cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31));
  }

  return kErrorOk;
}